

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_view_info.cpp
# Opt level: O2

void __thiscall
duckdb::CreateViewInfo::CreateViewInfo
          (CreateViewInfo *this,SchemaCatalogEntry *schema,string *view_name)

{
  string *psVar1;
  string sStack_78;
  string local_58;
  string local_38;
  
  psVar1 = Catalog::GetName_abi_cxx11_((schema->super_InCatalogEntry).catalog);
  ::std::__cxx11::string::string((string *)&local_58,(string *)psVar1);
  ::std::__cxx11::string::string
            ((string *)&sStack_78,(string *)&(schema->super_InCatalogEntry).super_CatalogEntry.name)
  ;
  ::std::__cxx11::string::string((string *)&local_38,(string *)view_name);
  CreateViewInfo(this,&local_58,&sStack_78,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&sStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

CreateViewInfo::CreateViewInfo(SchemaCatalogEntry &schema, string view_name)
    : CreateViewInfo(schema.catalog.GetName(), schema.name, std::move(view_name)) {
}